

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_names.cc
# Opt level: O0

bool __thiscall
bssl::ParseGeneralName
          (bssl *this,Input input,ParseGeneralNameIPAddressType ip_address_type,
          GeneralNames *subtrees,CertErrors *errors)

{
  Input input_00;
  Input input_01;
  bool bVar1;
  size_t sVar2;
  undefined4 in_register_0000000c;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *this_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  Span<const_unsigned_char> b;
  string_view str;
  Span<const_unsigned_char> b_00;
  string_view str_00;
  Span<const_unsigned_char> b_01;
  string_view str_01;
  Input mask_00;
  unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_> local_180;
  bssl *local_178;
  uchar *local_170;
  undefined1 local_168 [8];
  Input mask;
  Input addr;
  bssl *local_138;
  uchar *local_130;
  undefined1 local_128 [8];
  string_view s_2;
  Input name_value;
  undefined1 local_f8 [8];
  Parser name_parser;
  bssl *local_d0;
  uchar *local_c8;
  undefined1 local_c0 [8];
  string_view s_1;
  bssl *local_a0;
  uchar *local_98;
  undefined1 local_90 [8];
  string_view s;
  undefined1 auStack_78 [4];
  GeneralNameTypes name_type;
  Input value;
  CBS_ASN1_TAG tag;
  undefined1 local_50 [8];
  Parser parser;
  CertErrors *errors_local;
  GeneralNames *subtrees_local;
  ParseGeneralNameIPAddressType ip_address_type_local;
  Input input_local;
  
  this_00 = (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
            CONCAT44(in_register_0000000c,ip_address_type);
  parser.advance_len_ = (size_t)subtrees;
  if (subtrees == (GeneralNames *)0x0) {
    abort();
  }
  input_01.data_.size_ = (size_t)input.data_.data_;
  input_01.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_50,input_01);
  der::Input::Input((Input *)auStack_78);
  bVar1 = der::Parser::ReadTagAndValue
                    ((Parser *)local_50,(CBS_ASN1_TAG *)((long)&value.data_.size_ + 4),
                     (Input *)auStack_78);
  sVar2 = parser.advance_len_;
  if (!bVar1) {
    return false;
  }
  s._M_str._4_4_ = 0;
  if (value.data_.size_._4_4_ == 0xa0000000) {
    s._M_str._4_4_ = 1;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_00,(value_type *)auStack_78);
  }
  else if (value.data_.size_._4_4_ == 0x80000001) {
    s._M_str._4_4_ = 2;
    Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
              ((Span<unsigned_char_const> *)&local_a0,(Input *)auStack_78);
    b.size_ = extraout_RDX;
    b.data_ = local_98;
    _local_90 = BytesAsStringView(local_a0,b);
    str._M_str = local_90._8_8_;
    s_1._M_str = (char *)local_90;
    str._M_len = (size_t)str._M_str;
    bVar1 = string_util::IsAscii((string_util *)local_90,str);
    if (!bVar1) {
      CertErrors::AddError((CertErrors *)parser.advance_len_,"rfc822Name is not ASCII");
      return false;
    }
    ::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(this_00 + 1),(value_type *)local_90);
  }
  else if (value.data_.size_._4_4_ == 0x80000002) {
    s._M_str._4_4_ = 4;
    Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
              ((Span<unsigned_char_const> *)&local_d0,(Input *)auStack_78);
    b_00.size_ = extraout_RDX_00;
    b_00.data_ = local_c8;
    _local_c0 = BytesAsStringView(local_d0,b_00);
    str_00._M_str = local_c0._8_8_;
    name_parser.advance_len_ = (size_t)local_c0;
    str_00._M_len = (size_t)str_00._M_str;
    bVar1 = string_util::IsAscii((string_util *)local_c0,str_00);
    if (!bVar1) {
      CertErrors::AddError((CertErrors *)parser.advance_len_,"dNSName is not ASCII");
      return false;
    }
    ::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(this_00 + 2),(value_type *)local_c0);
  }
  else if (value.data_.size_._4_4_ == 0xa0000003) {
    s._M_str._4_4_ = 8;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_00 + 3,(value_type *)auStack_78);
  }
  else if (value.data_.size_._4_4_ == 0xa0000004) {
    s._M_str._4_4_ = 0x10;
    input_00.data_.size_ = (size_t)value.data_.data_;
    input_00.data_.data_ = _auStack_78;
    der::Parser::Parser((Parser *)local_f8,input_00);
    der::Input::Input((Input *)&s_2._M_str);
    bVar1 = der::Parser::ReadTag((Parser *)local_f8,0x20000010,(Input *)&s_2._M_str);
    if ((!bVar1) || (bVar1 = der::Parser::HasMore((Parser *)local_50), bVar1)) {
      return false;
    }
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_00 + 4,(value_type *)&s_2._M_str);
  }
  else if (value.data_.size_._4_4_ == 0xa0000005) {
    s._M_str._4_4_ = 0x20;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_00 + 5,(value_type *)auStack_78);
  }
  else if (value.data_.size_._4_4_ == 0x80000006) {
    s._M_str._4_4_ = 0x40;
    Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
              ((Span<unsigned_char_const> *)&local_138,(Input *)auStack_78);
    b_01.size_ = extraout_RDX_01;
    b_01.data_ = local_130;
    _local_128 = BytesAsStringView(local_138,b_01);
    str_01._M_str = local_128._8_8_;
    str_01._M_len = (size_t)str_01._M_str;
    bVar1 = string_util::IsAscii((string_util *)local_128,str_01);
    if (!bVar1) {
      CertErrors::AddError
                ((CertErrors *)parser.advance_len_,"uniformResourceIdentifier is not ASCII");
      return false;
    }
    ::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)(this_00 + 6),(value_type *)local_128);
  }
  else if (value.data_.size_._4_4_ == 0x80000007) {
    s._M_str._4_4_ = 0x80;
    if ((int)input.data_.size_ == 0) {
      sVar2 = der::Input::size((Input *)auStack_78);
      if ((sVar2 != 4) && (sVar2 = der::Input::size((Input *)auStack_78), sVar2 != 0x10)) {
        CertErrors::AddError((CertErrors *)parser.advance_len_,"Failed parsing iPAddress");
        return false;
      }
      ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                (this_00 + 7,(value_type *)auStack_78);
    }
    else {
      if ((int)input.data_.size_ != 1) {
        abort();
      }
      sVar2 = der::Input::size((Input *)auStack_78);
      if ((sVar2 != 8) && (sVar2 = der::Input::size((Input *)auStack_78), sVar2 != 0x20)) {
        CertErrors::AddError((CertErrors *)parser.advance_len_,"Failed parsing iPAddress");
        return false;
      }
      sVar2 = der::Input::size((Input *)auStack_78);
      join_0x00000010_0x00000000_ =
           (Span<const_unsigned_char>)der::Input::first((Input *)auStack_78,sVar2 >> 1);
      sVar2 = der::Input::size((Input *)auStack_78);
      _local_168 = (Span<const_unsigned_char>)
                   der::Input::subspan((Input *)auStack_78,sVar2 >> 1,0xffffffffffffffff);
      mask_00.data_.size_ = (uchar *)local_168._8_8_;
      local_178 = (bssl *)local_168;
      mask_00.data_.data_ = mask_00.data_.size_;
      local_170 = mask_00.data_.size_;
      bVar1 = IsValidNetmask((bssl *)local_168,mask_00);
      if (!bVar1) {
        CertErrors::AddError((CertErrors *)parser.advance_len_,"Failed parsing iPAddress");
        return false;
      }
      ::std::
      vector<std::pair<bssl::der::Input,bssl::der::Input>,std::allocator<std::pair<bssl::der::Input,bssl::der::Input>>>
      ::emplace_back<bssl::der::Input&,bssl::der::Input&>
                ((vector<std::pair<bssl::der::Input,bssl::der::Input>,std::allocator<std::pair<bssl::der::Input,bssl::der::Input>>>
                  *)(this_00 + 8),(Input *)&mask.data_.size_,(Input *)local_168);
    }
  }
  else {
    if (value.data_.size_._4_4_ != 0x80000008) {
      CreateCertErrorParams1SizeT((bssl *)&local_180,"tag",(ulong)value.data_.size_._4_4_);
      CertErrors::AddError((CertErrors *)sVar2,"Unknown GeneralName type",&local_180);
      ::std::unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>::
      ~unique_ptr(&local_180);
      return false;
    }
    s._M_str._4_4_ = 0x100;
    ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
              (this_00 + 9,(value_type *)auStack_78);
  }
  if (s._M_str._4_4_ != 0) {
    *(uint *)&this_00[10].super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
              _M_impl.super__Vector_impl_data._M_start =
         s._M_str._4_4_ |
         *(uint *)&this_00[10].
                   super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                   super__Vector_impl_data._M_start;
    return true;
  }
  abort();
}

Assistant:

[[nodiscard]] bool ParseGeneralName(
    der::Input input,
    GeneralNames::ParseGeneralNameIPAddressType ip_address_type,
    GeneralNames *subtrees, CertErrors *errors) {
  BSSL_CHECK(errors);
  der::Parser parser(input);
  CBS_ASN1_TAG tag;
  der::Input value;
  if (!parser.ReadTagAndValue(&tag, &value)) {
    return false;
  }
  GeneralNameTypes name_type = GENERAL_NAME_NONE;
  if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0)) {
    // otherName                       [0]     OtherName,
    name_type = GENERAL_NAME_OTHER_NAME;
    subtrees->other_names.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 1)) {
    // rfc822Name                      [1]     IA5String,
    name_type = GENERAL_NAME_RFC822_NAME;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kRFC822NameNotAscii);
      return false;
    }
    subtrees->rfc822_names.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 2)) {
    // dNSName                         [2]     IA5String,
    name_type = GENERAL_NAME_DNS_NAME;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kDnsNameNotAscii);
      return false;
    }
    subtrees->dns_names.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 3)) {
    // x400Address                     [3]     ORAddress,
    name_type = GENERAL_NAME_X400_ADDRESS;
    subtrees->x400_addresses.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 4)) {
    // directoryName                   [4]     Name,
    name_type = GENERAL_NAME_DIRECTORY_NAME;
    // Name is a CHOICE { rdnSequence  RDNSequence }, therefore the SEQUENCE
    // tag is explicit. Remove it, since the name matching functions expect
    // only the value portion.
    der::Parser name_parser(value);
    der::Input name_value;
    if (!name_parser.ReadTag(CBS_ASN1_SEQUENCE, &name_value) ||
        parser.HasMore()) {
      return false;
    }
    subtrees->directory_names.push_back(name_value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 5)) {
    // ediPartyName                    [5]     EDIPartyName,
    name_type = GENERAL_NAME_EDI_PARTY_NAME;
    subtrees->edi_party_names.push_back(value);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 6)) {
    // uniformResourceIdentifier       [6]     IA5String,
    name_type = GENERAL_NAME_UNIFORM_RESOURCE_IDENTIFIER;
    const std::string_view s = BytesAsStringView(value);
    if (!bssl::string_util::IsAscii(s)) {
      errors->AddError(kURINotAscii);
      return false;
    }
    subtrees->uniform_resource_identifiers.push_back(s);
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 7)) {
    // iPAddress                       [7]     OCTET STRING,
    name_type = GENERAL_NAME_IP_ADDRESS;
    if (ip_address_type == GeneralNames::IP_ADDRESS_ONLY) {
      // RFC 5280 section 4.2.1.6:
      // When the subjectAltName extension contains an iPAddress, the address
      // MUST be stored in the octet string in "network byte order", as
      // specified in [RFC791].  The least significant bit (LSB) of each octet
      // is the LSB of the corresponding byte in the network address.  For IP
      // version 4, as specified in [RFC791], the octet string MUST contain
      // exactly four octets.  For IP version 6, as specified in [RFC2460],
      // the octet string MUST contain exactly sixteen octets.
      if ((value.size() != kIPv4AddressSize &&
           value.size() != kIPv6AddressSize)) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      subtrees->ip_addresses.push_back(value);
    } else {
      BSSL_CHECK(ip_address_type == GeneralNames::IP_ADDRESS_AND_NETMASK);
      // RFC 5280 section 4.2.1.10:
      // The syntax of iPAddress MUST be as described in Section 4.2.1.6 with
      // the following additions specifically for name constraints. For IPv4
      // addresses, the iPAddress field of GeneralName MUST contain eight (8)
      // octets, encoded in the style of RFC 4632 (CIDR) to represent an
      // address range [RFC4632]. For IPv6 addresses, the iPAddress field
      // MUST contain 32 octets similarly encoded. For example, a name
      // constraint for "class C" subnet 192.0.2.0 is represented as the
      // octets C0 00 02 00 FF FF FF 00, representing the CIDR notation
      // 192.0.2.0/24 (mask 255.255.255.0).
      if (value.size() != kIPv4AddressSize * 2 &&
          value.size() != kIPv6AddressSize * 2) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      der::Input addr = value.first(value.size() / 2);
      der::Input mask = value.subspan(value.size() / 2);
      if (!IsValidNetmask(mask)) {
        errors->AddError(kFailedParsingIp);
        return false;
      }
      subtrees->ip_address_ranges.emplace_back(addr, mask);
    }
  } else if (tag == (CBS_ASN1_CONTEXT_SPECIFIC | 8)) {
    // registeredID                    [8]     OBJECT IDENTIFIER }
    name_type = GENERAL_NAME_REGISTERED_ID;
    subtrees->registered_ids.push_back(value);
  } else {
    errors->AddError(kUnknownGeneralNameType,
                     CreateCertErrorParams1SizeT("tag", tag));
    return false;
  }
  BSSL_CHECK(GENERAL_NAME_NONE != name_type);
  subtrees->present_name_types |= name_type;
  return true;
}